

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  int iVar1;
  undefined1 local_100 [8];
  lua_longjmp lj;
  unsigned_short oldnCcalls;
  void *ud_local;
  Pfunc f_local;
  lua_State *L_local;
  
  lj._214_2_ = L->nCcalls;
  lj.b[0].__saved_mask.__val[0xf]._0_4_ = 0;
  local_100 = (undefined1  [8])L->errorJmp;
  L->errorJmp = (lua_longjmp *)local_100;
  iVar1 = _setjmp((__jmp_buf_tag *)&lj);
  if (iVar1 == 0) {
    (*f)(L,ud);
  }
  L->errorJmp = (lua_longjmp *)local_100;
  L->nCcalls = lj._214_2_;
  return (int)lj.b[0].__saved_mask.__val[0xf];
}

Assistant:

int luaD_rawrunprotected(lua_State *L, Pfunc f, void *ud) {
    unsigned short oldnCcalls = L->nCcalls;
    struct lua_longjmp lj;
    lj.status = LUA_OK;
    lj.previous = L->errorJmp;  /* chain new error handler */
    L->errorJmp = &lj;
    LUAI_TRY(L, &lj,
             (*f)(L, ud);
    );
    L->errorJmp = lj.previous;  /* restore old error handler */
    L->nCcalls = oldnCcalls;
    return lj.status;
}